

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O3

int xc_func_find_ext_params_name(xc_func_type *p,char *name)

{
  char **ppcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)(p->info->ext_params).n;
  if (0 < lVar4) {
    ppcVar1 = (p->info->ext_params).names;
    lVar3 = 0;
    do {
      iVar2 = strcmp(ppcVar1[lVar3],name);
      if (iVar2 == 0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  return -1;
}

Assistant:

static int
xc_func_find_ext_params_name(const xc_func_type *p, const char *name) {
  int ii;
  assert(p != NULL && p->info->ext_params.n > 0);
  for(ii=0; ii<p->info->ext_params.n; ii++){
    if(strcmp(p->info->ext_params.names[ii], name) == 0) {
      return ii;
    }
  }
  return -1;
}